

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QRect __thiscall
QItemDelegatePrivate::textLayoutBounds
          (QItemDelegatePrivate *this,QStyleOptionViewItem *option,QRect *decorationRect,
          QRect *checkRect)

{
  QRect QVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  QWidget *pQVar5;
  QStyleOptionViewItem *in_RSI;
  QItemDelegatePrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  int textMargin;
  bool wrapText;
  QStyle *style;
  QWidget *w;
  QSizeF size;
  QRect rect;
  undefined4 in_stack_ffffffffffffff58;
  ViewItemFeature in_stack_ffffffffffffff5c;
  QRect *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QStyle *local_78;
  QSizeF local_30;
  QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4> local_1c;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_4_ = (in_RSI->super_QStyleOption).rect.x1;
  local_18._4_4_ = (in_RSI->super_QStyleOption).rect.y1;
  local_10._0_4_ = (in_RSI->super_QStyleOption).rect.x2;
  local_10._4_4_ = (in_RSI->super_QStyleOption).rect.y2;
  pQVar5 = widget(in_RDI,in_RSI);
  if (pQVar5 == (QWidget *)0x0) {
    local_78 = QApplication::style();
  }
  else {
    local_78 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  local_1c.super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
       (QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>)
       QFlags<QStyleOptionViewItem::ViewItemFeature>::operator&
                 ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)in_stack_ffffffffffffff60,
                  in_stack_ffffffffffffff5c);
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  bVar6 = IVar3 != 0;
  iVar4 = (**(code **)(*(long *)local_78 + 0xe0))(local_78,0x41,0,pQVar5);
  if (in_RSI->decorationPosition < Top) {
    if ((bVar6) && (bVar2 = QRect::isValid(in_stack_ffffffffffffff60), bVar2)) {
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    QRect::setWidth(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  else if (in_RSI->decorationPosition - Top < 2) {
    if (bVar6) {
      in_stack_ffffffffffffff7c = QSize::width((QSize *)0x850fce);
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + (iVar4 + 1) * -2;
    }
    else {
      in_stack_ffffffffffffff7c = 0x7fffff;
    }
    QRect::setWidth(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (bVar6) {
    bVar6 = QRect::isNull(in_stack_ffffffffffffff60);
    if (!bVar6) {
      in_stack_ffffffffffffff78 =
           QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRect::setWidth(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    bVar6 = QRect::isNull(in_stack_ffffffffffffff60);
    if (!bVar6) {
      in_stack_ffffffffffffff74 =
           QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QRect::setWidth(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    local_30.ht = -NAN;
    local_30.wd = -NAN;
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_30 = doTextLayout((QItemDelegatePrivate *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff74);
    QSizeF::height(&local_30);
    qCeil<double>(4.3085513414514e-317);
    QRect::setHeight(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar1.x2.m_i = (undefined4)local_10;
  QVar1.y2.m_i = local_10._4_4_;
  QVar1.x1.m_i = (undefined4)local_18;
  QVar1.y1.m_i = local_18._4_4_;
  return QVar1;
}

Assistant:

QRect QItemDelegatePrivate::textLayoutBounds(const QStyleOptionViewItem &option,
                                             const QRect &decorationRect, const QRect &checkRect) const
{
    QRect rect = option.rect;
    const QWidget *w = widget(option);
    QStyle *style = w ? w->style() : QApplication::style();
    const bool wrapText = option.features & QStyleOptionViewItem::WrapText;
    // see QItemDelegate::drawDisplay
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, w) + 1;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Left:
    case QStyleOptionViewItem::Right:
        rect.setWidth(wrapText && rect.isValid() ? rect.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    case QStyleOptionViewItem::Top:
    case QStyleOptionViewItem::Bottom:
        rect.setWidth(wrapText ? option.decorationSize.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    }

    if (wrapText) {
        if (!decorationRect.isNull())
            rect.setWidth(rect.width() - decorationRect.width() - 2 * textMargin);
        if (!checkRect.isNull())
            rect.setWidth(rect.width() - checkRect.width() - 2 * textMargin);
        // adjust height to be sure that the text fits
        const QSizeF size = doTextLayout(rect.width());
        rect.setHeight(qCeil(size.height()));
    }

    return rect;
}